

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O2

vector<duckdb::LogicalIndex,_true> * __thiscall
duckdb::UniqueConstraint::GetLogicalIndexes
          (vector<duckdb::LogicalIndex,_true> *__return_storage_ptr__,UniqueConstraint *this,
          ColumnList *column_list)

{
  pointer pbVar1;
  ColumnDefinition *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *col_name;
  pointer name;
  initializer_list<duckdb::LogicalIndex> __l;
  allocator_type local_31;
  LogicalIndex local_30;
  
  if ((this->index).index == 0xffffffffffffffff) {
    (__return_storage_ptr__->
    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pbVar1 = (this->columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name = (this->columns).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
      this_00 = ColumnList::GetColumn(column_list,name);
      local_30 = ColumnDefinition::Logical(this_00);
      ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
      emplace_back<duckdb::LogicalIndex>
                (&__return_storage_ptr__->
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,
                 &local_30);
    }
  }
  else {
    local_30 = GetIndex(this);
    __l._M_len = 1;
    __l._M_array = &local_30;
    ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,__l,
               &local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalIndex> UniqueConstraint::GetLogicalIndexes(const ColumnList &column_list) const {
	if (HasIndex()) {
		return {GetIndex()};
	}

	vector<LogicalIndex> indexes;
	for (auto &col_name : GetColumnNames()) {
		D_ASSERT(column_list.ColumnExists(col_name));
		auto &col = column_list.GetColumn(col_name);
		D_ASSERT(!col.Generated());
		indexes.push_back(col.Logical());
	}
	return indexes;
}